

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyParsePre(TidyDocImpl *doc,Node *pre,GetTokenMode mode)

{
  Dict *pDVar1;
  Bool BVar2;
  Node *node;
  Node *pNVar3;
  Node **ppNVar4;
  TidyTagId TVar5;
  Node *pNVar6;
  
  if ((pre->tag->model & 1) != 0) {
    return;
  }
  prvTidyInlineDup(doc,(Node *)0x0);
  node = prvTidyGetToken(doc,Preformatted);
  do {
    if (node == (Node *)0x0) {
      prvTidyReport(doc,pre,(Node *)0x0,0x25a);
      return;
    }
    pNVar3 = pre;
    if (node->type == EndTag) {
      pDVar1 = node->tag;
      if (pDVar1 != pre->tag) {
        if (pDVar1 == (Dict *)0x0) {
          TVar5 = TidyTag_UNKNOWN;
        }
        else {
          TVar5 = pDVar1->id;
        }
        for (pNVar6 = pre->parent; pNVar6 != (Node *)0x0; pNVar6 = pNVar6->parent) {
          if ((pNVar6->tag != (Dict *)0x0) && (pNVar6->tag->id == TVar5)) goto LAB_00140e7d;
        }
        goto LAB_00140dda;
      }
LAB_00140e7d:
      if ((pDVar1 == (Dict *)0x0) || ((pDVar1->id | TidyTag_DT) != TidyTag_HTML)) {
        if (pDVar1 == pre->tag) {
          prvTidyFreeNode(doc,node);
        }
        else {
          prvTidyReport(doc,pre,node,0x259);
          prvTidyUngetToken(doc);
        }
        pre->closed = yes;
        goto LAB_001410f1;
      }
      goto LAB_00140e94;
    }
LAB_00140dda:
    BVar2 = prvTidynodeIsText(node);
    if (BVar2 == no) {
      BVar2 = InsertMisc(pre,node);
      if (BVar2 == no) {
        if (node->tag == (Dict *)0x0) goto LAB_00140e94;
        if (node->tag->id == TidyTag_P) {
LAB_00140e31:
          if (node->type == StartTag) {
            prvTidyReport(doc,pre,node,0x28e);
            TrimSpaces(doc,pre);
            prvTidyCoerceNode(doc,node,TidyTag_BR,no,no);
            prvTidyFreeAttrs(doc,node);
            goto LAB_00140de6;
          }
        }
        else {
          BVar2 = prvTidynodeIsText(node);
          if ((BVar2 == no) &&
             (((node->tag == (Dict *)0x0 || (node->tag->id == TidyTag_PARAM)) ||
              (BVar2 = prvTidynodeHasCM(node,0x100010), BVar2 == no)))) {
            if (node->type != EndTag) {
              BVar2 = prvTidynodeHasCM(node,0x280);
              if ((BVar2 != no) || ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_TABLE))))
              {
                if (doc->lexer->exiled == no) {
                  prvTidyReport(doc,pre,node,0x259);
                }
                prvTidyUngetToken(doc);
                return;
              }
              pNVar3 = pre->parent;
              node->parent = pNVar3;
              if ((pNVar3 == (Node *)0x0) || (pNVar3->last != pre)) {
                pNVar3 = pre->next;
                node->next = pNVar3;
                if (pNVar3 != (Node *)0x0) {
                  ppNVar4 = &pNVar3->prev;
                  goto LAB_00141002;
                }
              }
              else {
                ppNVar4 = &pNVar3->last;
LAB_00141002:
                *ppNVar4 = node;
              }
              pre->next = node;
              node->prev = pre;
              prvTidyReport(doc,pre,node,0x259);
              ParseTag(doc,node,IgnoreWhitespace);
              pNVar3 = prvTidyInferredTag(doc,TidyTag_PRE);
              prvTidyReport(doc,pre,pNVar3,0x247);
              pNVar6 = node->parent;
              pNVar3->parent = pNVar6;
              if ((pNVar6 == (Node *)0x0) || (pNVar6->last != node)) {
                pNVar6 = node->next;
                pNVar3->next = pNVar6;
                if (pNVar6 != (Node *)0x0) {
                  ppNVar4 = &pNVar6->prev;
                  goto LAB_0014107e;
                }
              }
              else {
                ppNVar4 = &pNVar6->last;
LAB_0014107e:
                *ppNVar4 = pNVar3;
              }
              node->next = pNVar3;
              pNVar3->prev = node;
              goto LAB_00140eb4;
            }
            if ((doc->lexer->exiled != no) &&
               ((BVar2 = prvTidynodeHasCM(node,0x80), BVar2 != no ||
                ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_TABLE)))))) {
              prvTidyUngetToken(doc);
LAB_001410f1:
              TrimSpaces(doc,pre);
              return;
            }
          }
          else {
            if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_P)) goto LAB_00140e31;
            BVar2 = prvTidynodeIsElement(node);
            if (BVar2 != no) {
              if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_BR)) {
                TrimSpaces(doc,pre);
              }
              node->parent = pre;
              pNVar6 = pre->last;
              node->prev = pNVar6;
              ppNVar4 = &pNVar6->next;
              if (pNVar6 == (Node *)0x0) {
                ppNVar4 = &pre->content;
              }
              *ppNVar4 = node;
              pre->last = node;
              ParseTag(doc,node,Preformatted);
              goto LAB_00140eb4;
            }
          }
        }
LAB_00140e94:
        prvTidyReport(doc,pre,node,0x235);
        prvTidyFreeNode(doc,node);
      }
    }
    else {
LAB_00140de6:
      node->parent = pre;
      pNVar6 = pre->last;
      node->prev = pNVar6;
      ppNVar4 = &pNVar6->next;
      if (pNVar6 == (Node *)0x0) {
        ppNVar4 = &pre->content;
      }
      *ppNVar4 = node;
      pre->last = node;
    }
LAB_00140eb4:
    node = prvTidyGetToken(doc,Preformatted);
    pre = pNVar3;
  } while( true );
}

Assistant:

void TY_(ParsePre)( TidyDocImpl* doc, Node *pre, GetTokenMode ARG_UNUSED(mode) )
{
    Node *node;

    if (pre->tag->model & CM_EMPTY)
        return;

    TY_(InlineDup)( doc, NULL ); /* tell lexer to insert inlines if needed */

    while ((node = TY_(GetToken)(doc, Preformatted)) != NULL)
    {
        if ( node->type == EndTag && 
             (node->tag == pre->tag || DescendantOf(pre, TagId(node))) )
        {
            if (nodeIsBODY(node) || nodeIsHTML(node))
            {
                TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
                continue;
            }
            if (node->tag == pre->tag)
            {
                TY_(FreeNode)(doc, node);
            }
            else
            {
                TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE );
                TY_(UngetToken)( doc );
            }
            pre->closed = yes;
            TrimSpaces(doc, pre);
            return;
        }

        if (TY_(nodeIsText)(node))
        {
            TY_(InsertNodeAtEnd)(pre, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(pre, node))
            continue;

        if (node->tag == NULL)
        {
            TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* strip unexpected tags */
        if ( !PreContent(doc, node) )
        {
            Node *newnode;

            /* fix for http://tidy.sf.net/bug/772205 */
            if (node->type == EndTag)
            {
                /* http://tidy.sf.net/issue/1590220 */ 
               if ( doc->lexer->exiled
                   && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
               {
                  TY_(UngetToken)(doc);
                  TrimSpaces(doc, pre);
                  return;
               }

               TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
               TY_(FreeNode)(doc, node);
               continue;
            }
            /* http://tidy.sf.net/issue/1590220 */
            else if (TY_(nodeHasCM)(node, CM_TABLE|CM_ROW)
                     || nodeIsTABLE(node) )
            {
                if (!doc->lexer->exiled)
                    /* No missing close warning if exiled. */
                    TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE);

                TY_(UngetToken)(doc);
                return;
            }

            /*
              This is basically what Tidy 04 August 2000 did and far more accurate
              with respect to browser behaivour than the code commented out above.
              Tidy could try to propagate the <pre> into each disallowed child where
              <pre> is allowed in order to replicate some browsers behaivour, but
              there are a lot of exceptions, e.g. Internet Explorer does not propagate
              <pre> into table cells while Mozilla does. Opera 6 never propagates
              <pre> into blocklevel elements while Opera 7 behaves much like Mozilla.

              Tidy behaves thus mostly like Opera 6 except for nested <pre> elements
              which are handled like Mozilla takes them (Opera6 closes all <pre> after
              the first </pre>).

              There are similar issues like replacing <p> in <pre> with <br>, for
              example

                <pre>...<p>...</pre>                 (Input)
                <pre>...<br>...</pre>                (Tidy)
                <pre>...<br>...</pre>                (Opera 7 and Internet Explorer)
                <pre>...<br><br>...</pre>            (Opera 6 and Mozilla)

                <pre>...<p>...</p>...</pre>          (Input)
                <pre>...<br>......</pre>             (Tidy, BUG!)
                <pre>...<br>...<br>...</pre>         (Internet Explorer)
                <pre>...<br><br>...<br><br>...</pre> (Mozilla, Opera 6)
                <pre>...<br>...<br><br>...</pre>     (Opera 7)
                
              or something similar, they could also be closing the <pre> and propagate
              the <pre> into the newly opened <p>.

              Todo: IMG, OBJECT, APPLET, BIG, SMALL, SUB, SUP, FONT, and BASEFONT are
              dissallowed in <pre>, Tidy neither detects this nor does it perform any
              cleanup operation. Tidy should at least issue a warning if it encounters
              such constructs.

              Todo: discarding </p> is abviously a bug, it should be replaced by <br>.
            */
            TY_(InsertNodeAfterElement)(pre, node);
            TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE);
            ParseTag(doc, node, IgnoreWhitespace);

            newnode = TY_(InferredTag)(doc, TidyTag_PRE);
            TY_(Report)(doc, pre, newnode, INSERTING_TAG);
            pre = newnode;
            TY_(InsertNodeAfterElement)(node, pre);

            continue;
        }

        if ( nodeIsP(node) )
        {
            if (node->type == StartTag)
            {
                TY_(Report)(doc, pre, node, USING_BR_INPLACE_OF);

                /* trim white space before <p> in <pre>*/
                TrimSpaces(doc, pre);
            
                /* coerce both <p> and </p> to <br> */
                TY_(CoerceNode)(doc, node, TidyTag_BR, no, no);
                TY_(FreeAttrs)( doc, node ); /* discard align attribute etc. */
                TY_(InsertNodeAtEnd)( pre, node );
            }
            else
            {
                TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            }
            continue;
        }

        if ( TY_(nodeIsElement)(node) )
        {
            /* trim white space before <br> */
            if ( nodeIsBR(node) )
                TrimSpaces(doc, pre);
            
            TY_(InsertNodeAtEnd)(pre, node);
            ParseTag(doc, node, Preformatted);
            continue;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, pre, node, MISSING_ENDTAG_FOR);
}